

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lad.cc
# Opt level: O0

InputGraph
anon_unknown.dwarf_2e7dd8::read_any_lad
          (ifstream *infile,string *filename,bool directed,bool vertex_labels,bool edge_labels)

{
  string_view l_00;
  string_view label;
  string_view label_00;
  string_view l_01;
  string_view l_02;
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  istream *__a;
  size_type sVar6;
  byte in_CL;
  string *in_RDX;
  istream *in_RSI;
  unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> in_RDI;
  byte in_R8B;
  byte in_R9B;
  string after;
  string before;
  size_type equals_pos;
  string rest;
  int l_1;
  int e;
  int c;
  int c_end;
  int l;
  int r;
  InputGraph *result;
  size_t *in_stack_fffffffffffffc38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  allocator<char> *in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  int in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc84;
  char *in_stack_fffffffffffffc88;
  undefined1 uVar7;
  string *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffc98;
  string *filename_00;
  undefined4 in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca4;
  undefined8 in_stack_fffffffffffffcd8;
  InputGraph *in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  byte in_stack_fffffffffffffcef;
  int in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  string local_1d0 [80];
  __sv_type local_180;
  undefined1 local_16a;
  string local_169;
  int local_148;
  undefined1 local_142;
  int local_11c;
  int local_118;
  undefined1 local_112;
  int local_ec;
  __sv_type local_c8;
  undefined1 local_b2;
  int local_8c;
  __sv_type local_68;
  int local_58;
  undefined1 local_52;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  string *local_18;
  istream *local_10;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_1b = in_R9B & 1;
  local_1c = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  InputGraph::InputGraph
            ((InputGraph *)in_stack_fffffffffffffc90,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20)
             ,SUB81((ulong)in_stack_fffffffffffffc88 >> 0x18,0),
             SUB81((ulong)in_stack_fffffffffffffc88 >> 0x10,0));
  read_word((ifstream *)in_stack_fffffffffffffc40);
  InputGraph::resize((InputGraph *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     (int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
  bVar1 = std::ios::operator!(local_10 + *(long *)(*(long *)local_10 + -0x18));
  if ((bVar1 & 1) != 0) {
    local_52 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    uVar7 = (undefined1)((ulong)in_stack_fffffffffffffc88 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
               in_stack_fffffffffffffc70);
    GraphFileError::GraphFileError
              ((GraphFileError *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
               in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,(bool)uVar7);
    local_52 = 0;
    __cxa_throw(uVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  local_58 = 0;
  while( true ) {
    iVar4 = local_58;
    iVar3 = InputGraph::size((InputGraph *)0x211200);
    if (iVar3 <= iVar4) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      while( true ) {
        __a = std::operator>>(local_10,local_1d0);
        bVar2 = std::ios::operator_cast_to_bool(__a + *(long *)(*(long *)__a + -0x18));
        if (!bVar2) {
          bVar1 = std::ios::eof();
          uVar7 = (undefined1)((ulong)in_stack_fffffffffffffc88 >> 0x38);
          if ((bVar1 & 1) != 0) {
            local_1c = 1;
            std::__cxx11::string::~string(in_stack_fffffffffffffc40);
            if ((local_1c & 1) == 0) {
              InputGraph::~InputGraph((InputGraph *)0x211e31);
            }
            return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
                   (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
                   in_RDI._M_t.
                   super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
                   super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl;
          }
          uVar5 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                     (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                     (allocator<char> *)__a);
          GraphFileError::GraphFileError
                    ((GraphFileError *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0)
                     ,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,(bool)uVar7);
          __cxa_throw(uVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                     (char)((uint)in_stack_fffffffffffffc7c >> 0x18),(size_type)__a);
        if (sVar6 == 0xffffffffffffffff) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffffc58,
                   CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (size_type)in_stack_fffffffffffffc48);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffffc58,
                   CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (size_type)in_stack_fffffffffffffc48);
        in_stack_fffffffffffffc54 =
             std::__cxx11::stoi(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,0);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc40);
        l_02._M_len._7_1_ = in_stack_fffffffffffffcef;
        l_02._M_len._0_7_ = in_stack_fffffffffffffce8;
        l_02._M_str._0_4_ = in_stack_fffffffffffffcf0;
        l_02._M_str._4_4_ = in_stack_fffffffffffffcf4;
        InputGraph::set_vertex_name
                  (in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),l_02);
        std::__cxx11::string::~string(in_stack_fffffffffffffc40);
        std::__cxx11::string::~string(in_stack_fffffffffffffc40);
      }
      uVar5 = __cxa_allocate_exception(0x30);
      std::operator+(in_stack_fffffffffffffc88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
      uVar7 = (undefined1)((ulong)in_stack_fffffffffffffc88 >> 0x38);
      std::operator+(in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
      GraphFileError::GraphFileError
                ((GraphFileError *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,(bool)uVar7);
      __cxa_throw(uVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    std::__cxx11::to_string(in_stack_fffffffffffffc7c);
    local_68 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc40);
    l_01._M_len._7_1_ = in_stack_fffffffffffffcef;
    l_01._M_len._0_7_ = in_stack_fffffffffffffce8;
    l_01._M_str._0_4_ = in_stack_fffffffffffffcf0;
    l_01._M_str._4_4_ = in_stack_fffffffffffffcf4;
    InputGraph::set_vertex_name
              (in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),l_01);
    std::__cxx11::string::~string(in_stack_fffffffffffffc40);
    if ((local_1a & 1) != 0) {
      local_8c = read_word((ifstream *)in_stack_fffffffffffffc40);
      bVar1 = std::ios::operator!(local_10 + *(long *)(*(long *)local_10 + -0x18));
      if ((bVar1 & 1) != 0) {
        local_b2 = 1;
        uVar5 = __cxa_allocate_exception(0x30);
        uVar7 = (undefined1)((ulong)in_stack_fffffffffffffc88 >> 0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                   (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                   in_stack_fffffffffffffc70);
        GraphFileError::GraphFileError
                  ((GraphFileError *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,(bool)uVar7);
        local_b2 = 0;
        __cxa_throw(uVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
      in_stack_fffffffffffffcf4 = local_58;
      std::__cxx11::to_string(in_stack_fffffffffffffc7c);
      local_c8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc40)
      ;
      l_00._M_str = in_stack_fffffffffffffc60;
      l_00._M_len = (size_t)in_stack_fffffffffffffc58;
      InputGraph::set_vertex_label
                ((InputGraph *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),l_00);
      std::__cxx11::string::~string(in_stack_fffffffffffffc40);
    }
    in_stack_fffffffffffffcf0 = read_word((ifstream *)in_stack_fffffffffffffc40);
    local_ec = in_stack_fffffffffffffcf0;
    in_stack_fffffffffffffcef = std::ios::operator!(local_10 + *(long *)(*(long *)local_10 + -0x18))
    ;
    if ((in_stack_fffffffffffffcef & 1) != 0) break;
    for (local_118 = 0; local_118 < local_ec; local_118 = local_118 + 1) {
      iVar4 = read_word((ifstream *)in_stack_fffffffffffffc40);
      local_11c = iVar4;
      if ((iVar4 < 0) || (iVar3 = InputGraph::size((InputGraph *)0x21167e), iVar3 <= iVar4)) {
        uVar7 = (undefined1)((ulong)in_stack_fffffffffffffc88 >> 0x38);
        local_142 = 1;
        uVar5 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                   (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                   in_stack_fffffffffffffc70);
        GraphFileError::GraphFileError
                  ((GraphFileError *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,(bool)uVar7);
        local_142 = 0;
        __cxa_throw(uVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
      if ((local_1b & 1) == 0) {
        if ((local_19 & 1) == 0) {
          InputGraph::add_edge
                    ((InputGraph *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                     in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
        }
        else {
          in_stack_fffffffffffffc78 = local_58;
          in_stack_fffffffffffffc7c = local_11c;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     (char *)in_stack_fffffffffffffc48);
          label_00._M_str._0_4_ = in_stack_fffffffffffffca0;
          label_00._M_len = (size_t)in_stack_fffffffffffffc98;
          label_00._M_str._4_4_ = in_stack_fffffffffffffca4;
          InputGraph::add_directed_edge
                    ((InputGraph *)in_stack_fffffffffffffc90,
                     (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),(int)in_stack_fffffffffffffc88,
                     label_00);
        }
      }
      else {
        in_stack_fffffffffffffca4 = read_word((ifstream *)in_stack_fffffffffffffc40);
        local_148 = in_stack_fffffffffffffca4;
        if (in_stack_fffffffffffffca4 < 0) {
          local_16a = 1;
          uVar5 = __cxa_allocate_exception(0x30);
          filename_00 = &local_169;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                     (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                     in_stack_fffffffffffffc70);
          GraphFileError::GraphFileError
                    ((GraphFileError *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0)
                     ,filename_00,local_18,SUB81((ulong)uVar5 >> 0x38,0));
          local_16a = 0;
          __cxa_throw(uVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        in_stack_fffffffffffffc80 = local_58;
        in_stack_fffffffffffffc84 = local_11c;
        std::__cxx11::to_string(in_stack_fffffffffffffc7c);
        local_180 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffc40);
        label._M_str._0_4_ = in_stack_fffffffffffffca0;
        label._M_len = (size_t)in_stack_fffffffffffffc98;
        label._M_str._4_4_ = in_stack_fffffffffffffca4;
        InputGraph::add_directed_edge
                  ((InputGraph *)in_stack_fffffffffffffc90,
                   (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),(int)in_stack_fffffffffffffc88,
                   label);
        std::__cxx11::string::~string(in_stack_fffffffffffffc40);
      }
    }
    local_58 = local_58 + 1;
  }
  local_112 = 1;
  uVar5 = __cxa_allocate_exception(0x30);
  uVar7 = (undefined1)((ulong)in_stack_fffffffffffffc88 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
             (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70);
  GraphFileError::GraphFileError
            ((GraphFileError *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
             in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,(bool)uVar7);
  local_112 = 0;
  __cxa_throw(uVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
}

Assistant:

auto read_any_lad(ifstream && infile, const string & filename,
        bool directed,
        bool vertex_labels,
        bool edge_labels) -> InputGraph
    {
        InputGraph result{0, vertex_labels, edge_labels};

        result.resize(read_word(infile));
        if (! infile)
            throw GraphFileError{filename, "error reading size", true};

        for (int r = 0; r < result.size(); ++r) {
            result.set_vertex_name(r, to_string(r));

            if (vertex_labels) {
                int l = read_word(infile);
                if (! infile)
                    throw GraphFileError{filename, "error reading label", true};

                result.set_vertex_label(r, to_string(l));
            }

            int c_end = read_word(infile);
            if (! infile)
                throw GraphFileError{filename, "error reading edges count", true};

            for (int c = 0; c < c_end; ++c) {
                int e = read_word(infile);

                if (e < 0 || e >= result.size())
                    throw GraphFileError{filename, "edge index out of bounds", true};

                if (edge_labels) {
                    int l = read_word(infile);
                    if (l < 0)
                        throw GraphFileError{filename, "edge label invalid", true};

                    result.add_directed_edge(r, e, to_string(l));
                }
                else if (directed)
                    result.add_directed_edge(r, e, "");
                else
                    result.add_edge(r, e);
            }
        }

        string rest;
        while (infile >> rest) {
            auto equals_pos = rest.find('=');
            if (string::npos == equals_pos)
                throw GraphFileError{filename, "EOF not reached, next text is \"" + rest + "\"", true};
            else {
                string before = rest.substr(0, equals_pos), after = rest.substr(equals_pos + 1);
                result.set_vertex_name(stoi(before), after);
            }
        }
        if (! infile.eof())
            throw GraphFileError{filename, "EOF not reached", true};

        return result;
    }